

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O3

void __thiscall
embree::ParallelRadixSort<embree::avx::BVHBuilderMorton::BuildPrim,_unsigned_int>::sort
          (ParallelRadixSort<embree::avx::BVHBuilderMorton::BuildPrim,_unsigned_int> *this,
          size_t blockSize)

{
  anon_union_8_2_12391d8c_for_BuildPrim_0 *__last;
  uint uVar1;
  anon_struct_8_2_236f074c_for_anon_union_8_2_12391d8c_for_BuildPrim_0_0 aVar2;
  long lVar3;
  anon_union_8_2_12391d8c_for_BuildPrim_0 *paVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  anon_union_8_2_12391d8c_for_BuildPrim_0 *paVar8;
  anon_union_8_2_12391d8c_for_BuildPrim_0 *paVar9;
  BuildPrim *__i;
  anon_union_8_2_12391d8c_for_BuildPrim_0 *paVar10;
  size_t numTasks;
  value_type __val_1;
  size_t __n;
  anon_union_8_2_12391d8c_for_BuildPrim_0 *paVar11;
  value_type __val;
  
  uVar7 = this->N;
  if (blockSize < uVar7) {
    uVar6 = ((blockSize + uVar7) - 1) / blockSize;
    iVar5 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar7 = (long)iVar5;
    if (uVar6 < (ulong)(long)iVar5) {
      uVar7 = uVar6;
    }
    numTasks = 0x40;
    if (uVar7 < 0x40) {
      numTasks = uVar7;
    }
    tbbRadixSort(this,numTasks);
    return;
  }
  if (uVar7 != 0) {
    paVar10 = &this->src->field_0;
    __last = paVar10 + uVar7;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<embree::avx::BVHBuilderMorton::BuildPrim*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(embree::avx::BVHBuilderMorton::BuildPrim_const&,embree::avx::BVHBuilderMorton::BuildPrim_const&)>>
              ((BuildPrim *)&paVar10->field_0,(BuildPrim *)&__last->field_0,
               (ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_embree::avx::BVHBuilderMorton::BuildPrim_&,_const_embree::avx::BVHBuilderMorton::BuildPrim_&)>
                )0x1468680);
    if ((long)uVar7 < 0x11) {
      if (uVar7 != 1) {
        paVar9 = paVar10 + 1;
        paVar11 = paVar10;
        do {
          paVar8 = paVar9;
          aVar2 = paVar11[1].field_0;
          if (paVar11[1].field_0.code < (paVar10->field_0).code) {
            memmove((void *)((long)paVar11 + (0x10 - ((long)paVar8 - (long)paVar10))),paVar10,
                    (long)paVar8 - (long)paVar10);
            paVar9 = paVar10;
          }
          else {
            uVar1 = (paVar11->field_0).code;
            paVar9 = paVar8;
            while (aVar2.code < uVar1) {
              *paVar9 = paVar9[-1];
              uVar1 = paVar9[-2].field_0.code;
              paVar9 = paVar9 + -1;
            }
          }
          paVar9->field_0 = aVar2;
          paVar9 = paVar8 + 1;
          paVar11 = paVar8;
        } while (paVar8 + 1 != __last);
      }
    }
    else {
      __n = 8;
      paVar9 = paVar10;
      paVar11 = paVar10 + 1;
      do {
        paVar8 = (anon_union_8_2_12391d8c_for_BuildPrim_0 *)((long)paVar10 + __n);
        aVar2 = *(anon_struct_8_2_236f074c_for_anon_union_8_2_12391d8c_for_BuildPrim_0_0 *)
                 ((long)paVar10 + __n);
        if (*(uint *)((long)paVar10 + __n) < (paVar10->field_0).code) {
          memmove(paVar10 + 1,paVar10,__n);
          paVar9 = paVar10;
        }
        else {
          uVar1 = (paVar9->field_0).code;
          paVar9 = paVar8;
          paVar4 = paVar11;
          while (aVar2.code < uVar1) {
            paVar9 = paVar4 + -1;
            *paVar4 = paVar4[-1];
            uVar1 = paVar4[-2].field_0.code;
            paVar4 = paVar9;
          }
        }
        paVar9->field_0 = aVar2;
        __n = __n + 8;
        paVar11 = paVar11 + 1;
        paVar9 = paVar8;
      } while (__n != 0x80);
      paVar10 = paVar10 + 0x10;
      do {
        aVar2 = paVar10->field_0;
        uVar1 = paVar10[-1].field_0.code;
        paVar9 = paVar10;
        while (aVar2.code < uVar1) {
          *paVar9 = paVar9[-1];
          uVar1 = paVar9[-2].field_0.code;
          paVar9 = paVar9 + -1;
        }
        paVar9->field_0 = aVar2;
        paVar10 = paVar10 + 1;
      } while (paVar10 != __last);
    }
  }
  return;
}

Assistant:

void sort(const size_t blockSize)
    {
      assert(blockSize > 0);
      
      /* perform single threaded sort for small N */
      if (N<=blockSize) // handles also special case of 0!
      {	  
        /* do inplace sort inside destination array */
        std::sort(src,src+N,compare<Ty>);
      }
      
      /* perform parallel sort for large N */
      else 
      {
        const size_t numThreads = min((N+blockSize-1)/blockSize,TaskScheduler::threadCount(),size_t(MAX_TASKS));
        tbbRadixSort(numThreads);
      }
    }